

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::remove_executor(task_impl_base<_1a67ba37_> *this)

{
  element_type *node;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  task_impl_base<_1a67ba37_> *local_10;
  task_impl_base<_1a67ba37_> *this_local;
  
  local_10 = this;
  ensure_task_not_running(this);
  std::__shared_ptr<transwarp::executor,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->executor_).super___shared_ptr<transwarp::executor,_(__gnu_cxx::_Lock_policy)2>)
  ;
  node = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )&this->node_);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&local_20,(nullptr_t)0x0);
  node_manip::set_executor(node,&local_20);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_20);
  return;
}

Assistant:

void remove_executor() override {
        ensure_task_not_running();
        executor_.reset();
        transwarp::detail::node_manip::set_executor(*node_, nullptr);
    }